

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O2

void __thiscall CoreML::Specification::LSTMParams::LSTMParams(LSTMParams *this,LSTMParams *from)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  
  (this->super_MessageLite)._internal_metadata_.ptr_ = 0;
  (this->super_MessageLite)._vptr_MessageLite = (_func_int **)&PTR__LSTMParams_003fefa8;
  (this->_cached_size_).size_.super___atomic_base<int>._M_i = 0;
  google::protobuf::internal::InternalMetadata::MergeFrom<std::__cxx11::string>
            (&(this->super_MessageLite)._internal_metadata_,
             &(from->super_MessageLite)._internal_metadata_);
  this->coupledinputandforgetgate_ = from->coupledinputandforgetgate_;
  bVar1 = from->sequenceoutput_;
  bVar2 = from->hasbiasvectors_;
  bVar3 = from->forgetbias_;
  bVar4 = from->haspeepholevectors_;
  this->cellclipthreshold_ = from->cellclipthreshold_;
  this->sequenceoutput_ = bVar1;
  this->hasbiasvectors_ = bVar2;
  this->forgetbias_ = bVar3;
  this->haspeepholevectors_ = bVar4;
  return;
}

Assistant:

LSTMParams::LSTMParams(const LSTMParams& from)
  : ::PROTOBUF_NAMESPACE_ID::MessageLite() {
  _internal_metadata_.MergeFrom<std::string>(from._internal_metadata_);
  ::memcpy(&cellclipthreshold_, &from.cellclipthreshold_,
    static_cast<size_t>(reinterpret_cast<char*>(&coupledinputandforgetgate_) -
    reinterpret_cast<char*>(&cellclipthreshold_)) + sizeof(coupledinputandforgetgate_));
  // @@protoc_insertion_point(copy_constructor:CoreML.Specification.LSTMParams)
}